

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O3

void big_array_iter_advance(BigArrayIter *iter)

{
  long lVar1;
  BigArray *pBVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  
  pBVar2 = iter->array;
  if (iter->contiguous != 0) {
    iter->dataptr = (void *)((long)iter->dataptr + pBVar2->strides[(long)pBVar2->ndim + -1]);
    return;
  }
  lVar4 = (long)pBVar2->ndim;
  iter->pos[lVar4 + -1] = iter->pos[lVar4 + -1] + 1;
  pvVar3 = (void *)((long)iter->dataptr + pBVar2->strides[lVar4 + -1]);
  iter->dataptr = pvVar3;
  if ((0 < lVar4) && (lVar5 = iter->pos[lVar4 + -1], lVar5 == pBVar2->dims[lVar4 + -1])) {
    do {
      pvVar3 = (void *)((long)pvVar3 - lVar5 * pBVar2->strides[lVar4 + -1]);
      iter->pos[lVar4 + -1] = 0;
      if (lVar4 == 1) break;
      lVar5 = iter->pos[lVar4 + -2] + 1;
      iter->pos[lVar4 + -2] = lVar5;
      pvVar3 = (void *)((long)pvVar3 + pBVar2->strides[lVar4 + -2]);
      lVar1 = lVar4 * 8;
      lVar4 = lVar4 + -1;
    } while (lVar5 == *(long *)(pBVar2->dtype + lVar1 + -4));
    iter->dataptr = pvVar3;
  }
  return;
}

Assistant:

void
big_array_iter_advance(BigArrayIter * iter)
{
    BigArray * array = iter->array;

    if(iter->contiguous) {
        iter->dataptr = (char*) iter->dataptr + array->strides[array->ndim - 1];
        return;
    }
    int k;
    iter->pos[array->ndim - 1] ++;
    iter->dataptr = ((char*) iter->dataptr) + array->strides[array->ndim - 1];
    for(k = array->ndim - 1; k >= 0; k --) {
        if(iter->pos[k] == array->dims[k]) {
            iter->dataptr = ((char*) iter->dataptr) - array->strides[k] * iter->pos[k];
            iter->pos[k] = 0;
            if(k > 0) {
                iter->pos[k - 1] ++;
                iter->dataptr = ((char*) iter->dataptr) + array->strides[k - 1];
            }
        } else {
            break;
        }
    }
}